

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomizer_world.cpp
# Opt level: O1

void __thiscall RandomizerWorld::dark_region(RandomizerWorld *this,WorldRegion *region)

{
  pointer ppWVar1;
  WorldPath *pWVar2;
  mapped_type *ppIVar3;
  pointer ppWVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  pointer local_48;
  pointer local_40;
  WorldNode *local_38;
  
  this->_dark_region = region;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator=
            (&(this->super_World)._dark_maps,&region->_dark_map_ids);
  local_40 = (region->_nodes).super__Vector_base<WorldNode_*,_std::allocator<WorldNode_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_48 = (region->_nodes).super__Vector_base<WorldNode_*,_std::allocator<WorldNode_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (local_40 != local_48) {
    do {
      local_38 = *local_40;
      ppWVar1 = (local_38->_ingoing_paths).
                super__Vector_base<WorldPath_*,_std::allocator<WorldPath_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      for (ppWVar4 = (local_38->_ingoing_paths).
                     super__Vector_base<WorldPath_*,_std::allocator<WorldPath_*>_>._M_impl.
                     super__Vector_impl_data._M_start; ppWVar4 != ppWVar1; ppWVar4 = ppWVar4 + 1) {
        pWVar2 = *ppWVar4;
        if (pWVar2->_from_node->_region != region) {
          local_68._M_dataplus._M_p._0_1_ = 0x1a;
          ppIVar3 = std::
                    map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                    ::at((map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                          *)this,(key_type_conflict *)&local_68);
          local_68._M_dataplus._M_p = (pointer)*ppIVar3;
          std::vector<Item*,std::allocator<Item*>>::emplace_back<Item*&>
                    ((vector<Item*,std::allocator<Item*>> *)&pWVar2->_required_items,
                     (Item **)&local_68);
        }
      }
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"in a very dark place","")
      ;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string_const&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &local_38->_hints,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      local_40 = local_40 + 1;
    } while (local_40 != local_48);
  }
  return;
}

Assistant:

void RandomizerWorld::dark_region(WorldRegion* region)
{
    _dark_region = region;
    this->dark_maps(region->dark_map_ids());

    for(WorldNode* node : region->nodes())
    {
        for (WorldPath* path : node->ingoing_paths())
            if(path->origin()->region() != region)
                path->add_required_item(this->item(ITEM_LANTERN));

        node->add_hint("in a very dark place");
    }
}